

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  
  *(undefined4 *)(*(long *)(in_RDI + 8) + (long)in_ESI * 0x70) = 4;
  lVar3 = *(long *)(in_RDI + 8) + (long)in_ESI * 0x70;
  puVar4 = (undefined8 *)(lVar3 + 8);
  if (puVar4 != in_RDX) {
    if (in_RDX[1] != 0) {
      LOCK();
      *(int *)in_RDX[1] = *(int *)in_RDX[1] + 1;
      UNLOCK();
    }
    if (*(long *)(lVar3 + 0x10) != 0) {
      piVar2 = *(int **)(lVar3 + 0x10);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(lVar3 + 0x28) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(lVar3 + 0x28) + 0x18))(*(long **)(lVar3 + 0x28),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    *(undefined8 *)(lVar3 + 0x18) = 0;
    *(undefined4 *)(lVar3 + 0x20) = 0;
    *(undefined4 *)(lVar3 + 0x30) = 0;
    *(undefined4 *)(lVar3 + 0x34) = 0;
    *(undefined4 *)(lVar3 + 0x38) = 0;
    *(undefined4 *)(lVar3 + 0x3c) = 0;
    *(undefined4 *)(lVar3 + 0x40) = 0;
    *(undefined8 *)(lVar3 + 0x48) = 0;
    *(undefined8 *)(lVar3 + 0x10) = 0;
    *puVar4 = *in_RDX;
    *(undefined8 *)(lVar3 + 0x10) = in_RDX[1];
    *(undefined8 *)(lVar3 + 0x18) = in_RDX[2];
    *(undefined4 *)(lVar3 + 0x20) = *(undefined4 *)(in_RDX + 3);
    *(undefined8 *)(lVar3 + 0x28) = in_RDX[4];
    *(undefined4 *)(lVar3 + 0x30) = *(undefined4 *)(in_RDX + 5);
    *(undefined4 *)(lVar3 + 0x34) = *(undefined4 *)((long)in_RDX + 0x2c);
    *(undefined4 *)(lVar3 + 0x38) = *(undefined4 *)(in_RDX + 6);
    *(undefined4 *)(lVar3 + 0x3c) = *(undefined4 *)((long)in_RDX + 0x34);
    *(undefined4 *)(lVar3 + 0x40) = *(undefined4 *)(in_RDX + 7);
    *(undefined8 *)(lVar3 + 0x48) = in_RDX[8];
  }
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    d->params[id].type = 4;
    d->params[id].v = v;
}